

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O1

char * ver_get_version_string(filemgr_magic_t magic)

{
  char *pcVar1;
  
  pcVar1 = "ForestDB v1.x format";
  if ((magic != 0xdeadcafebeefbeef) && (magic != 0xdeadcafebeefc001)) {
    if (magic == 0xdeadcafebeefc002) {
      return "ForestDB v2.x format";
    }
    pcVar1 = "unknown";
  }
  return pcVar1;
}

Assistant:

const char* ver_get_version_string(filemgr_magic_t magic) {
    switch (magic) {
    case FILEMGR_MAGIC_000:
        return "ForestDB v1.x format";
    case FILEMGR_MAGIC_001:
        return "ForestDB v1.x format";
    case FILEMGR_MAGIC_002:
        return "ForestDB v2.x format";
    }
    return "unknown";
}